

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

void __thiscall FIX::Dictionary::~Dictionary(Dictionary *this)

{
  Dictionary *this_local;
  
  ~Dictionary(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

virtual ~Dictionary() {}